

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  bool bVar1;
  value_type *this_00;
  optional<tinyusdz::Token> local_98;
  undefined4 local_70;
  optional<tinyusdz::value::Value> local_68;
  undefined1 local_48 [8];
  optional<tinyusdz::value::Value> pv;
  size_t idx_local;
  PrimVar *this_local;
  
  bVar1 = has_timesamples(this);
  if (bVar1) {
    tinyusdz::value::TimeSamples::get_value(&local_68,&this->_ts,idx);
    nonstd::optional_lite::optional<tinyusdz::value::Value>::optional<tinyusdz::value::Value,_0>
              ((optional<tinyusdz::value::Value> *)local_48,&local_68);
    nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional(&local_68);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if (bVar1) {
      this_00 = nonstd::optional_lite::optional<tinyusdz::value::Value>::value
                          ((optional<tinyusdz::value::Value> *)local_48);
      tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_98,this_00,false);
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                (__return_storage_ptr__,&local_98);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_98);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Token>::optional(__return_storage_ptr__);
    }
    local_70 = 1;
    nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional
              ((optional<tinyusdz::value::Value> *)local_48);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Token>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_ts_value(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    nonstd::optional<value::Value> pv = _ts.get_value(idx);
    if (!pv) {
      return nonstd::nullopt;
    }

    return pv.value().get_value<T>();
  }